

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O2

int ikcp_input(ikcpcb *kcp,char *data,long size)

{
  IUINT32 *pIVar1;
  IQUEUEHEAD *pIVar2;
  byte bVar3;
  IUINT32 IVar4;
  IUINT32 IVar5;
  uint uVar6;
  IUINT32 IVar7;
  IUINT32 IVar8;
  IQUEUEHEAD *pIVar9;
  IUINT32 *ptr;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  IUINT32 IVar13;
  IUINT32 *pIVar14;
  uint uVar15;
  uint uVar16;
  IKCPSEG *seg;
  ikcpcb *kcp_00;
  ulong uVar17;
  uint uVar18;
  IKCPSEG *newseg;
  int iVar19;
  IQUEUEHEAD *pIVar20;
  IQUEUEHEAD *pIVar21;
  ikcpcb *piVar22;
  uint local_58;
  
  IVar4 = kcp->snd_una;
  newseg = (IKCPSEG *)data;
  if (((kcp->logmask & 2) != 0) && (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)
     ) {
    newseg = (IKCPSEG *)0x2;
    ikcp_log(kcp,2,"[RI] %d bytes",size & 0xffffffff);
  }
  iVar19 = -1;
  if (0x17 < (int)size && data != (char *)0x0) {
    pIVar2 = &kcp->snd_buf;
    pIVar1 = &kcp->snd_nxt;
    local_58 = 0;
    bVar10 = false;
    while (0x17 < size) {
      IVar5 = *(IUINT32 *)data;
      if (IVar5 != kcp->conv) {
        return -1;
      }
      uVar15 = *(uint *)((long)data + 0x14);
      kcp_00 = (ikcpcb *)(ulong)uVar15;
      if (((int)uVar15 < 0) ||
         (piVar22 = (ikcpcb *)(size + -0x18), size = (long)piVar22 - (long)kcp_00, piVar22 < kcp_00)
         ) {
        return -2;
      }
      IVar13 = *(IUINT32 *)((long)data + 4);
      if ((byte)((char)IVar13 + 0xabU) < 0xfc) {
LAB_0014907b:
        return -3;
      }
      bVar3 = *(byte *)((long)data + 5);
      uVar16 = *(uint *)((long)data + 8);
      uVar6 = *(uint *)((long)data + 0xc);
      IVar7 = *(IUINT32 *)((long)data + 0x10);
      uVar18 = (uint)*(ushort *)((long)data + 6);
      kcp->rmt_wnd = uVar18;
      pIVar20 = (kcp->snd_buf).next;
      while ((pIVar20 != pIVar2 && (0 < (int)(IVar7 - *(int *)((long)&pIVar20[2].next + 4))))) {
        pIVar21 = pIVar20->next;
        pIVar9 = pIVar20->prev;
        pIVar21->prev = pIVar9;
        pIVar9->next = pIVar21;
        pIVar20->next = (IQUEUEHEAD *)0x0;
        pIVar20->prev = (IQUEUEHEAD *)0x0;
        ikcp_free(pIVar20);
        kcp->nsnd_buf = kcp->nsnd_buf - 1;
        pIVar20 = pIVar21;
      }
      pIVar20 = (kcp->snd_buf).next;
      pIVar14 = (IUINT32 *)((long)&pIVar20[2].next + 4);
      if (pIVar20 == pIVar2) {
        pIVar14 = pIVar1;
      }
      IVar8 = *pIVar14;
      kcp->snd_una = IVar8;
      switch((char)IVar13) {
      case 'Q':
        if (((kcp->logmask & 0x10) != 0) &&
           (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
          newseg = (IKCPSEG *)0x10;
          ikcp_log(kcp,0x10,"input psh: sn=%lu ts=%lu",(ulong)uVar6,(ulong)uVar16);
        }
        if ((int)(uVar6 - (kcp->rcv_nxt + kcp->rcv_wnd)) < 0) {
          IVar13 = kcp->ackcount;
          if (kcp->ackblock < IVar13 + 1) {
            uVar12 = 8;
            do {
              uVar11 = uVar12;
              uVar12 = uVar11 * 2;
            } while (uVar11 < IVar13 + 1);
            pIVar14 = (IUINT32 *)ikcp_malloc((ulong)uVar11 << 3);
            if (pIVar14 == (IUINT32 *)0x0) {
              __assert_fail("acklist != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                            ,0x28a,"void ikcp_ack_push(ikcpcb *, IUINT32, IUINT32)");
            }
            ptr = kcp->acklist;
            if (ptr != (IUINT32 *)0x0) {
              uVar12 = 1;
              for (uVar17 = 0; uVar17 < kcp->ackcount; uVar17 = uVar17 + 1) {
                pIVar14[uVar12 - 1] = ptr[uVar12 - 1];
                newseg = (IKCPSEG *)(ulong)ptr[uVar12];
                pIVar14[uVar12] = ptr[uVar12];
                uVar12 = uVar12 + 2;
              }
              ikcp_free(ptr);
            }
            kcp->acklist = pIVar14;
            kcp->ackblock = uVar11;
            IVar13 = kcp->ackcount;
          }
          else {
            pIVar14 = kcp->acklist;
          }
          pIVar14[IVar13 * 2] = uVar6;
          pIVar14[(ulong)(IVar13 * 2) + 1] = uVar16;
          kcp->ackcount = kcp->ackcount + 1;
          if (-1 < (int)(uVar6 - kcp->rcv_nxt)) {
            newseg = ikcp_segment_new(kcp_00,(int)newseg);
            newseg->conv = IVar5;
            newseg->cmd = 0x51;
            newseg->frg = (uint)bVar3;
            newseg->wnd = uVar18;
            newseg->ts = uVar16;
            newseg->sn = uVar6;
            newseg->una = IVar7;
            newseg->len = uVar15;
            if (uVar15 != 0) {
              memcpy(newseg->data,(IUINT32 *)((long)data + 0x18),(size_t)kcp_00);
            }
            ikcp_parse_data(kcp,newseg);
          }
        }
        break;
      case 'R':
        uVar15 = kcp->current - uVar16;
        if (-1 < (int)uVar15) {
          iVar19 = kcp->rx_srtt;
          if (iVar19 == 0) {
            kcp->rx_srtt = uVar15;
            uVar18 = uVar15 >> 1;
            kcp->rx_rttval = uVar18;
          }
          else {
            uVar12 = uVar15 - iVar19;
            uVar18 = -uVar12;
            if (0 < (int)uVar12) {
              uVar18 = uVar12;
            }
            uVar18 = (uint)((long)((long)kcp->rx_rttval * 3 + (ulong)uVar18) / 4);
            kcp->rx_rttval = uVar18;
            iVar19 = iVar19 * 7 + uVar15;
            uVar15 = iVar19 / 8;
            if (iVar19 < 8) {
              uVar15 = 1;
            }
            kcp->rx_srtt = uVar15;
          }
          uVar12 = uVar18 * 4;
          if (uVar18 * 4 < kcp->interval) {
            uVar12 = kcp->interval;
          }
          uVar18 = uVar12 + uVar15;
          if (uVar12 + uVar15 < (uint)kcp->rx_minrto) {
            uVar18 = kcp->rx_minrto;
          }
          if (59999 < uVar18) {
            uVar18 = 60000;
          }
          newseg = (IKCPSEG *)(ulong)uVar18;
          kcp->rx_rto = uVar18;
        }
        if ((-1 < (int)(uVar6 - IVar8)) && (pIVar21 = pIVar20, (int)(uVar6 - *pIVar1) < 0)) {
          do {
            if (pIVar21 == pIVar2) break;
            pIVar9 = pIVar21->next;
            uVar15 = *(uint *)((long)&pIVar21[2].next + 4);
            if (uVar6 == uVar15) {
              pIVar20 = pIVar21->prev;
              pIVar9->prev = pIVar20;
              pIVar20->next = pIVar9;
              pIVar21->next = (IQUEUEHEAD *)0x0;
              pIVar21->prev = (IQUEUEHEAD *)0x0;
              ikcp_free(pIVar21);
              kcp->nsnd_buf = kcp->nsnd_buf - 1;
              pIVar20 = (kcp->snd_buf).next;
              break;
            }
            pIVar21 = pIVar9;
          } while (-1 < (int)(uVar6 - uVar15));
        }
        pIVar14 = (IUINT32 *)((long)&pIVar20[2].next + 4);
        if (pIVar20 == pIVar2) {
          pIVar14 = pIVar1;
        }
        kcp->snd_una = *pIVar14;
        if (0 < (int)(uVar6 - local_58)) {
          local_58 = uVar6;
        }
        if (!bVar10) {
          local_58 = uVar6;
        }
        if (((kcp->logmask & 0x20) != 0) &&
           (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
          newseg = (IKCPSEG *)0x20;
          ikcp_log(kcp,0x20,"input ack: sn=%lu rtt=%ld rto=%ld",(ulong)uVar6,
                   (long)(int)(kcp->current - uVar16));
        }
        bVar10 = true;
        break;
      case 'S':
        *(byte *)&kcp->probe = (byte)kcp->probe | 2;
        if (((kcp->logmask & 0x40) != 0) &&
           (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
          newseg = (IKCPSEG *)0x40;
          ikcp_log(kcp,0x40,"input probe");
        }
        break;
      case 'T':
        if (((kcp->logmask & 0x80) != 0) &&
           (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
          newseg = (IKCPSEG *)0x80;
          ikcp_log(kcp,0x80,"input wins: %lu",(ulong)uVar18);
        }
        break;
      default:
        goto LAB_0014907b;
      }
      data = (char *)((long)data + 0x18 + (long)kcp_00);
    }
    IVar5 = kcp->snd_una;
    if (((bVar10) && (-1 < (int)(local_58 - IVar5))) && ((int)(local_58 - *pIVar1) < 0)) {
      pIVar20 = pIVar2->next;
      while ((pIVar21 = pIVar20, pIVar21 != pIVar2 &&
             (uVar15 = *(uint *)((long)&pIVar21[2].next + 4), -1 < (int)(local_58 - uVar15)))) {
        pIVar20 = pIVar21->next;
        if (local_58 != uVar15) {
          *(int *)&pIVar21[3].prev = *(int *)&pIVar21[3].prev + 1;
        }
      }
    }
    iVar19 = 0;
    if (0 < (int)(IVar5 - IVar4)) {
      uVar15 = kcp->rmt_wnd;
      uVar16 = kcp->cwnd;
      if (uVar16 < uVar15) {
        uVar6 = kcp->mss;
        if (uVar16 < kcp->ssthresh) {
          uVar16 = uVar16 + 1;
          kcp->cwnd = uVar16;
          kcp->incr = kcp->incr + uVar6;
        }
        else {
          uVar18 = kcp->incr;
          if (kcp->incr <= uVar6) {
            uVar18 = uVar6;
          }
          uVar18 = (uVar6 >> 4) + uVar18 + (uVar6 * uVar6) / uVar18;
          kcp->incr = uVar18;
          if ((uVar16 + 1) * uVar6 <= uVar18) {
            uVar16 = ((uVar6 + uVar18) - 1) / (uVar6 + (uVar6 == 0));
            kcp->cwnd = uVar16;
          }
        }
        if (uVar15 < uVar16) {
          kcp->cwnd = uVar15;
          kcp->incr = uVar6 * uVar15;
        }
      }
    }
  }
  return iVar19;
}

Assistant:

int ikcp_input(ikcpcb *kcp, const char *data, long size)
{
	IUINT32 prev_una = kcp->snd_una;
	IUINT32 maxack = 0, latest_ts = 0;
	int flag = 0;

	if (ikcp_canlog(kcp, IKCP_LOG_INPUT)) {
		ikcp_log(kcp, IKCP_LOG_INPUT, "[RI] %d bytes", (int)size);
	}

	if (data == NULL || (int)size < (int)IKCP_OVERHEAD) return -1;

	while (1) {
		IUINT32 ts, sn, len, una, conv;
		IUINT16 wnd;
		IUINT8 cmd, frg;
		IKCPSEG *seg;

		if (size < (int)IKCP_OVERHEAD) break;

		data = ikcp_decode32u(data, &conv);
		if (conv != kcp->conv) return -1;

		data = ikcp_decode8u(data, &cmd);
		data = ikcp_decode8u(data, &frg);
		data = ikcp_decode16u(data, &wnd);
		data = ikcp_decode32u(data, &ts);
		data = ikcp_decode32u(data, &sn);
		data = ikcp_decode32u(data, &una);
		data = ikcp_decode32u(data, &len);

		size -= IKCP_OVERHEAD;

		if ((long)size < (long)len || (int)len < 0) return -2;

		if (cmd != IKCP_CMD_PUSH && cmd != IKCP_CMD_ACK &&
			cmd != IKCP_CMD_WASK && cmd != IKCP_CMD_WINS) 
			return -3;

		kcp->rmt_wnd = wnd;
		ikcp_parse_una(kcp, una);
		ikcp_shrink_buf(kcp);

		if (cmd == IKCP_CMD_ACK) {
			if (_itimediff(kcp->current, ts) >= 0) {
				ikcp_update_ack(kcp, _itimediff(kcp->current, ts));
			}
			ikcp_parse_ack(kcp, sn);
			ikcp_shrink_buf(kcp);
			if (flag == 0) {
				flag = 1;
				maxack = sn;
				latest_ts = ts;
			}	else {
				if (_itimediff(sn, maxack) > 0) {
				#ifndef IKCP_FASTACK_CONSERVE
					maxack = sn;
					latest_ts = ts;
				#else
					if (_itimediff(ts, latest_ts) > 0) {
						maxack = sn;
						latest_ts = ts;
					}
				#endif
				}
			}
			if (ikcp_canlog(kcp, IKCP_LOG_IN_ACK)) {
				ikcp_log(kcp, IKCP_LOG_IN_ACK, 
					"input ack: sn=%lu rtt=%ld rto=%ld", (unsigned long)sn, 
					(long)_itimediff(kcp->current, ts),
					(long)kcp->rx_rto);
			}
		}
		else if (cmd == IKCP_CMD_PUSH) {
			if (ikcp_canlog(kcp, IKCP_LOG_IN_DATA)) {
				ikcp_log(kcp, IKCP_LOG_IN_DATA, 
					"input psh: sn=%lu ts=%lu", (unsigned long)sn, (unsigned long)ts);
			}
			if (_itimediff(sn, kcp->rcv_nxt + kcp->rcv_wnd) < 0) {
				ikcp_ack_push(kcp, sn, ts);
				if (_itimediff(sn, kcp->rcv_nxt) >= 0) {
					seg = ikcp_segment_new(kcp, len);
					seg->conv = conv;
					seg->cmd = cmd;
					seg->frg = frg;
					seg->wnd = wnd;
					seg->ts = ts;
					seg->sn = sn;
					seg->una = una;
					seg->len = len;

					if (len > 0) {
						memcpy(seg->data, data, len);
					}

					ikcp_parse_data(kcp, seg);
				}
			}
		}
		else if (cmd == IKCP_CMD_WASK) {
			// ready to send back IKCP_CMD_WINS in ikcp_flush
			// tell remote my window size
			kcp->probe |= IKCP_ASK_TELL;
			if (ikcp_canlog(kcp, IKCP_LOG_IN_PROBE)) {
				ikcp_log(kcp, IKCP_LOG_IN_PROBE, "input probe");
			}
		}
		else if (cmd == IKCP_CMD_WINS) {
			// do nothing
			if (ikcp_canlog(kcp, IKCP_LOG_IN_WINS)) {
				ikcp_log(kcp, IKCP_LOG_IN_WINS,
					"input wins: %lu", (unsigned long)(wnd));
			}
		}
		else {
			return -3;
		}

		data += len;
		size -= len;
	}

	if (flag != 0) {
		ikcp_parse_fastack(kcp, maxack, latest_ts);
	}

	if (_itimediff(kcp->snd_una, prev_una) > 0) {
		if (kcp->cwnd < kcp->rmt_wnd) {
			IUINT32 mss = kcp->mss;
			if (kcp->cwnd < kcp->ssthresh) {
				kcp->cwnd++;
				kcp->incr += mss;
			}	else {
				if (kcp->incr < mss) kcp->incr = mss;
				kcp->incr += (mss * mss) / kcp->incr + (mss / 16);
				if ((kcp->cwnd + 1) * mss <= kcp->incr) {
				#if 1
					kcp->cwnd = (kcp->incr + mss - 1) / ((mss > 0)? mss : 1);
				#else
					kcp->cwnd++;
				#endif
				}
			}
			if (kcp->cwnd > kcp->rmt_wnd) {
				kcp->cwnd = kcp->rmt_wnd;
				kcp->incr = kcp->rmt_wnd * mss;
			}
		}
	}

	return 0;
}